

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

void __thiscall
BackwardPass::TraceInstrUses(BackwardPass *this,BasicBlock *block,Instr *instr,bool isStart)

{
  bool bVar1;
  char16_t *local_48;
  char16_t *local_40;
  char16 *tagName;
  bool isStart_local;
  Instr *instr_local;
  BasicBlock *block_local;
  BackwardPass *this_local;
  
  bVar1 = IsCollectionPass(this);
  if ((((!bVar1) || (this->tag == CaptureByteCodeRegUsePhase)) &&
      (bVar1 = IsTraceEnabled(this), bVar1)) && ((DAT_01ec73ca & 1) != 0)) {
    if (this->tag == CaptureByteCodeRegUsePhase) {
      local_40 = L"CAPTURE BYTECODE REGISTER";
    }
    else {
      if (this->tag == BackwardPhase) {
        local_48 = L"BACKWARD";
      }
      else {
        local_48 = L"UNKNOWN";
        if (this->tag == DeadStorePhase) {
          local_48 = L"DEADSTORE";
        }
      }
      local_40 = local_48;
    }
    if (isStart) {
      Output::Print(L">>>>>>>>>>>>>>>>>>>>>> %s: Instr Start\n",local_40);
    }
    else {
      Output::Print(L"---------------------------------------\n");
    }
    IR::Instr::Dump(instr);
    DumpBlockData(this,block,instr);
    if (isStart) {
      Output::Print(L"----------------------------------------\n");
    }
    else {
      Output::Print(L"<<<<<<<<<<<<<<<<<<<<<< %s: Instr End\n",local_40);
    }
  }
  return;
}

Assistant:

void
BackwardPass::TraceInstrUses(BasicBlock * block, IR::Instr* instr, bool isStart)
{
    if ((!IsCollectionPass() || tag == Js::CaptureByteCodeRegUsePhase) && IsTraceEnabled() && Js::Configuration::Global.flags.Verbose)
    {
        const char16* tagName = 
            tag == Js::CaptureByteCodeRegUsePhase ? _u("CAPTURE BYTECODE REGISTER") : (
            tag == Js::BackwardPhase ? _u("BACKWARD") : (
            tag == Js::DeadStorePhase ? _u("DEADSTORE") :
            _u("UNKNOWN")
        ));
        if (isStart)
        {
            Output::Print(_u(">>>>>>>>>>>>>>>>>>>>>> %s: Instr Start\n"), tagName);
        }
        else
        {
            Output::Print(_u("---------------------------------------\n"));
        }
        instr->Dump();
        DumpBlockData(block, instr);
        if (isStart)
        {
            Output::Print(_u("----------------------------------------\n"));
        }
        else
        {
            Output::Print(_u("<<<<<<<<<<<<<<<<<<<<<< %s: Instr End\n"), tagName);
        }
    }
}